

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-dump.cpp
# Opt level: O2

void dump_graph(CDGraph *graph)

{
  undefined8 *puVar1;
  CDNode *nd;
  long *plVar2;
  long lVar3;
  bool bVar4;
  ostream *poVar5;
  long *plVar6;
  CDGraph *__range1;
  undefined8 *puVar7;
  EdgesT *__range2;
  long lVar8;
  
  puVar1 = *(undefined8 **)(graph + 0x28);
  for (puVar7 = *(undefined8 **)(graph + 0x20); puVar7 != puVar1; puVar7 = puVar7 + 1) {
    nd = (CDNode *)*puVar7;
    poVar5 = std::operator<<((ostream *)&std::cout," ");
    poVar5 = std::operator<<(poVar5,(string *)graph);
    poVar5 = std::operator<<(poVar5,"_");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," [label=\"");
    poVar5 = std::operator<<(poVar5,(string *)graph);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"\"");
    bVar4 = dg::CDGraph::isPredicate(graph,nd);
    if (bVar4) {
      std::operator<<((ostream *)&std::cout," color=blue");
    }
    std::operator<<((ostream *)&std::cout,"]\n");
  }
  plVar2 = *(long **)(graph + 0x28);
  for (plVar6 = *(long **)(graph + 0x20); plVar6 != plVar2; plVar6 = plVar6 + 1) {
    lVar3 = ((long *)*plVar6)[1];
    for (lVar8 = *(long *)*plVar6; lVar8 != lVar3; lVar8 = lVar8 + 8) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      poVar5 = std::operator<<(poVar5,(string *)graph);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," -> ");
      poVar5 = std::operator<<(poVar5,(string *)graph);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"\n");
    }
  }
  return;
}

Assistant:

static void dump_graph(CDGraph *graph) {
    assert(graph);
    // dump nodes
    for (const auto *nd : *graph) {
        std::cout << " " << graph->getName() << "_" << nd->getID()
                  << " [label=\"" << graph->getName() << ":" << nd->getID()
                  << "\"";
        if (graph->isPredicate(*nd)) {
            std::cout << " color=blue";
        }
        std::cout << "]\n";
    }

    // dump edges
    for (const auto *nd : *graph) {
        for (const auto *succ : nd->successors()) {
            std::cout << " " << graph->getName() << "_" << nd->getID() << " -> "
                      << graph->getName() << "_" << succ->getID() << "\n";
        }
    }
}